

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O3

void USPE_seasonal(double *inp,int N,int s,int p,int q,double *phi,double *theta)

{
  size_t sVar1;
  bool bVar2;
  uint N_00;
  double *acov;
  void *__src;
  double *A;
  double *b;
  int *ipiv;
  long lVar3;
  double *__dest;
  undefined8 *__ptr;
  double *array;
  double *__s;
  double *x;
  double *A_00;
  int *ipiv_00;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  double *pdVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  
  uVar18 = (ulong)(uint)q;
  uVar7 = (ulong)(uint)p;
  uVar12 = q + p + 1;
  acov = (double *)malloc((long)(int)(uVar12 * s) * 8);
  __src = malloc((long)(int)uVar12 << 3);
  lVar13 = (long)p;
  A = (double *)malloc(lVar13 * 8 * lVar13);
  b = (double *)malloc(lVar13 * 8);
  ipiv = (int *)malloc(lVar13 * 4);
  N_00 = q + 1;
  lVar3 = (long)(int)N_00;
  sVar1 = lVar3 * 8;
  __dest = (double *)malloc(sVar1);
  uVar4 = (ulong)(p + 1U);
  __ptr = (undefined8 *)malloc((long)(int)(p + 1U) << 3);
  array = (double *)malloc(sVar1);
  __s = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  A_00 = (double *)malloc(sVar1 * lVar3);
  ipiv_00 = (int *)malloc(lVar3 << 2);
  autocovar(inp,N,acov,uVar12 * s);
  if (-1 < q + p) {
    uVar11 = 0;
    pdVar5 = acov;
    do {
      *(double *)((long)__src + uVar11 * 8) = *pdVar5;
      uVar11 = uVar11 + 1;
      pdVar5 = pdVar5 + s;
    } while (uVar12 != uVar11);
  }
  *__ptr = 0xbff0000000000000;
  if (0 < p) {
    memset(phi,0,uVar7 * 8);
  }
  if (0 < q) {
    memset(theta,0,uVar18 * 8);
  }
  lVar3 = (long)q;
  if (p < 1) {
LAB_00134e3d:
    if (p != 0) goto LAB_00134e42;
    if (q < 0) goto LAB_00134f0b;
    memcpy(__dest,__src,(ulong)N_00 << 3);
  }
  else {
    uVar6 = 1;
    uVar11 = uVar18;
    pdVar5 = A;
    do {
      iVar9 = (int)uVar11;
      lVar16 = 0;
      do {
        iVar15 = (int)uVar11;
        uVar17 = (ulong)(uint)-iVar15;
        if (0 < iVar15) {
          uVar17 = uVar11;
        }
        pdVar5[lVar16] = *(double *)((long)__src + uVar17 * 8);
        lVar16 = lVar16 + 1;
        uVar11 = (ulong)(iVar15 - 1);
      } while (uVar4 - 1 != lVar16);
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + lVar13;
      uVar11 = (ulong)(iVar9 + 1);
    } while (uVar6 != uVar4);
    memcpy(b,(void *)((long)__src + lVar3 * 8 + 8),uVar7 * 8);
    ludecomp(A,p,ipiv);
    linsolve(A,p,b,ipiv,phi);
    if (p < 1) goto LAB_00134e3d;
    memcpy(__ptr + 1,phi,uVar7 << 3);
LAB_00134e42:
    if (q < 0) {
LAB_00134f0b:
      dVar21 = *__dest;
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      *__s = dVar21;
      bVar2 = true;
      goto LAB_00134f97;
    }
    uVar7 = 0;
    do {
      dVar21 = 0.0;
      if (-1 < p) {
        uVar11 = uVar7 & 0xffffffff;
        uVar6 = 0;
        do {
          iVar9 = (int)uVar11;
          uVar17 = 0;
          do {
            iVar15 = (int)uVar11;
            uVar19 = (ulong)(uint)-iVar15;
            if (0 < iVar15) {
              uVar19 = uVar11;
            }
            dVar21 = dVar21 + (double)__ptr[uVar17] * (double)__ptr[uVar6] *
                              *(double *)((long)__src + uVar19 * 8);
            uVar17 = uVar17 + 1;
            uVar11 = (ulong)(iVar15 - 1);
          } while (uVar4 != uVar17);
          uVar6 = uVar6 + 1;
          uVar11 = (ulong)(iVar9 + 1);
        } while (uVar6 != uVar4);
      }
      __dest[uVar7] = dVar21;
      uVar7 = uVar7 + 1;
    } while (uVar7 != N_00);
  }
  sVar1 = (ulong)N_00 * 8;
  memset(__s,0,sVar1);
  memset(array,0,sVar1);
  dVar21 = *__dest;
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  *__s = dVar21;
  uVar4 = 0;
  pdVar5 = __s;
  uVar12 = N_00;
  do {
    dVar21 = array[uVar4];
    if (uVar4 <= uVar18) {
      uVar7 = 0;
      do {
        dVar21 = dVar21 + __s[uVar7] * pdVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar12 != uVar7);
    }
    array[uVar4] = dVar21 - __dest[uVar4];
    uVar4 = uVar4 + 1;
    uVar12 = uVar12 - 1;
    pdVar5 = pdVar5 + 1;
  } while (uVar4 != N_00);
  bVar2 = false;
LAB_00134f97:
  dVar21 = array_max_abs(array,N_00);
  if (0.0001 < dVar21) {
    uVar4 = (ulong)N_00;
    uVar12 = 0;
    do {
      if (bVar2) {
        ludecomp(A_00,N_00,ipiv_00);
        linsolve(A_00,N_00,array,ipiv_00,x);
      }
      else {
        lVar13 = 0;
        uVar7 = 0;
        pdVar5 = __s;
        pdVar8 = __s;
        pdVar14 = A_00;
        do {
          uVar18 = 0;
          do {
            dVar21 = 0.0;
            if ((long)(uVar7 + uVar18) <= lVar3) {
              dVar21 = pdVar5[uVar18] + 0.0;
            }
            if (-1 < (long)(lVar13 + uVar18)) {
              dVar21 = dVar21 + pdVar8[uVar18];
            }
            pdVar14[uVar18] = dVar21;
            uVar18 = uVar18 + 1;
          } while (uVar4 != uVar18);
          uVar7 = uVar7 + 1;
          pdVar14 = pdVar14 + uVar4;
          lVar13 = lVar13 + -1;
          pdVar8 = pdVar8 + -1;
          pdVar5 = pdVar5 + 1;
        } while (uVar7 != uVar4);
        ludecomp(A_00,N_00,ipiv_00);
        linsolve(A_00,N_00,array,ipiv_00,x);
        memset(array,0,uVar4 * 8);
        uVar7 = 0;
        do {
          __s[uVar7] = __s[uVar7] - x[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        uVar7 = 0;
        pdVar5 = __s;
        uVar10 = N_00;
        do {
          dVar21 = array[uVar7];
          if ((long)uVar7 <= lVar3) {
            uVar18 = 0;
            do {
              dVar21 = dVar21 + __s[uVar18] * pdVar5[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar10 != uVar18);
          }
          array[uVar7] = dVar21 - __dest[uVar7];
          uVar7 = uVar7 + 1;
          uVar10 = uVar10 - 1;
          pdVar5 = pdVar5 + 1;
        } while (uVar7 != uVar4);
      }
      dVar21 = array_max_abs(array,N_00);
    } while ((0.0001 < dVar21) && (bVar20 = uVar12 < 199, uVar12 = uVar12 + 1, bVar20));
  }
  if (0 < q) {
    dVar21 = *__s;
    lVar3 = 0;
    do {
      theta[lVar3] = -__s[lVar3 + 1] / dVar21;
      lVar3 = lVar3 + 1;
    } while ((ulong)N_00 - 1 != lVar3);
  }
  free(__src);
  free(acov);
  free(A);
  free(b);
  free(ipiv);
  free(__dest);
  free(__ptr);
  free(array);
  free(__s);
  free(A_00);
  free(ipiv_00);
  free(x);
  return;
}

Assistant:

void USPE_seasonal(double *inp,int N,int s,int p, int q, double *phi,double *theta) {
	int K,i,j,l,t,temp,it1;
	double tempd,epsilon;
	double *b,*c,*A,*c2,*x,*f,*tau,*T,*h,*cv;
	int *ipiv,*ipiv2;

	K = (p + q + 1) * s;

	cv = (double *) malloc(sizeof(double) * K);
	c = (double *) malloc(sizeof(double) * (p+q+1));
	A = (double *) malloc(sizeof(double) * p * p);
	b = (double *) malloc(sizeof(double) * p);
	ipiv = (int *) malloc(sizeof(int) * p);
	c2 = (double *) malloc(sizeof(double) * (q+1));
	x = (double *) malloc(sizeof(double) * (p+1));
	f = (double *) malloc(sizeof(double) * (q+1));
	tau = (double *) malloc(sizeof(double) * (q+1));
	h = (double *) malloc(sizeof(double) * (q+1));
	T = (double *) malloc(sizeof(double) * (q+1) * (q+1));
	ipiv2 = (int *) malloc(sizeof(int) * (q+1));


	autocovar(inp,N,cv,K);
	for(i = 0; i < p+q+1;++i) {
		c[i] = cv[i*s];
	}

	x[0] = -1.0;

	for(i = 0; i < p;++i) {
		phi[i] = 0.0;
	}

	for(i = 0; i < q;++i) {
		theta[i] = 0.0;
	}

	//Step 1
	if (p > 0) {

		for(i = 1; i <= p;++i) {
			t = (i-1) * p;
			for(j = 1; j <= p;++j) {
				temp = q+i-j;
				if (temp < 0) {
					temp = -temp;
				}
				A[t+j-1] = c[temp];
			}
		}

		for(i = 0; i < p;++i) {
			b[i] = c[q+i+1];
		}

		ludecomp(A,p,ipiv);
		linsolve(A,p,b,ipiv,phi);

	}


	for(i = 0; i < p;++i) {
		x[i+1] = phi[i];
	}

	// Step 2
	if (p == 0) {
		for(i = 0; i < q + 1; ++i) {
			c2[i] = c[i];
		}
	} else {
		for(j = 0; j < q + 1;++j) {
			tempd = 0.0;
			for(i = 0; i < p + 1;++i) {
				for(l = 0; l < p + 1; ++l) {
					temp = j + i - l;
					if (temp < 0) {
						temp = -temp;
					}
					tempd += x[i]*x[l]*c[temp];
				}
			}
			c2[j] = tempd;
		}

	}

	//Step 3 Newton Raphson Method

	epsilon = 0.0001;

	for(i = 0; i <= q;++i) {
		tau[i] = 0.0;
		f[i] = 0.0;
	}
	tau[0] = sqrt(c2[0]);

	for(j = 0; j <= q;++j) {
		for(i = 0; i < q-j+1;++i) {
			f[j] += tau[i] * tau[i+j];
		}
		f[j] -= c2[j];
	}

	it1 = 0;

	while (array_max_abs(f,q+1) > epsilon && it1 < 200) {
		it1++;
		for(i = 0; i < q+1;++i) {
			t = i * (q+1);
			for(j = 0; j < q+1;++j) {
				tempd = 0.0;
				if (i + j <= q) {
					tempd=tempd+tau[i+j];
				}
				if (j - i >= 0 ) {
					tempd=tempd+tau[j-i];
				}
				T[t+j] = tempd;
			}
		}
		//mdisplay(T,q+1,q+1);
		ludecomp(T,q+1,ipiv2);
		linsolve(T,q+1,f,ipiv2,h);

		for(i = 0; i < q+1;++i) {
			tau[i] = tau[i] - h[i];
			f[i] = 0.0;
		}

		for(j = 0; j < q+1;++j) {
			for(i = 0; i < q-j+1;++i) {
				f[j]=f[j]+tau[i]*tau[i+j];
			}
			f[j] = f[j] - c2[j];
		}
	}

	for(j = 1; j < q+1;++j) {
		theta[j-1]=-1.0*tau[j]/tau[0];
	}


	free(c);
	free(cv);
	free(A);
	free(b);
	free(ipiv);
	free(c2);
	free(x);
	free(f);
	free(tau);
	free(T);
	free(ipiv2);
	free(h);

}